

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_starts_withi_Test<std::pair<char16_t,_char32_t>_>::TestBody
          (UnicodeFullTest_starts_withi_Test<std::pair<char16_t,_char32_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  size_t sVar3;
  char32_t (*in_RDX) [5];
  char32_t (*extraout_RDX_00) [5];
  char32_t (*extraout_RDX_01) [5];
  char32_t (*extraout_RDX_02) [5];
  char32_t (*extraout_RDX_03) [5];
  char32_t (*extraout_RDX_04) [5];
  char32_t (*extraout_RDX_05) [5];
  char32_t (*extraout_RDX_07) [5];
  char32_t (*extraout_RDX_08) [5];
  char32_t (*extraout_RDX_09) [5];
  char32_t (*extraout_RDX_10) [5];
  char32_t (*extraout_RDX_11) [5];
  char32_t (*extraout_RDX_12) [5];
  char32_t (*extraout_RDX_14) [5];
  char32_t (*extraout_RDX_15) [5];
  char32_t (*extraout_RDX_16) [5];
  char32_t (*extraout_RDX_17) [5];
  char32_t (*extraout_RDX_18) [5];
  char32_t (*extraout_RDX_19) [5];
  char32_t (*extraout_RDX_21) [5];
  char32_t (*extraout_RDX_22) [5];
  char32_t (*extraout_RDX_23) [5];
  char32_t (*extraout_RDX_24) [5];
  char32_t (*extraout_RDX_25) [5];
  char32_t (*extraout_RDX_26) [5];
  char32_t (*extraout_RDX_28) [5];
  char32_t (*extraout_RDX_29) [5];
  char32_t (*extraout_RDX_30) [5];
  char32_t (*extraout_RDX_31) [5];
  char32_t (*extraout_RDX_32) [5];
  char32_t (*extraout_RDX_33) [5];
  char32_t (*extraout_RDX_35) [5];
  char32_t (*extraout_RDX_36) [5];
  char32_t (*extraout_RDX_37) [5];
  char32_t (*extraout_RDX_38) [5];
  char32_t (*extraout_RDX_39) [5];
  char32_t (*extraout_RDX_40) [5];
  char32_t (*extraout_RDX_42) [5];
  char32_t (*extraout_RDX_43) [5];
  char32_t (*extraout_RDX_44) [5];
  char32_t (*extraout_RDX_45) [5];
  char32_t (*extraout_RDX_46) [5];
  char32_t (*extraout_RDX_47) [5];
  char32_t (*extraout_RDX_49) [5];
  char32_t (*extraout_RDX_50) [5];
  char32_t (*extraout_RDX_51) [5];
  char32_t (*extraout_RDX_52) [5];
  char32_t (*extraout_RDX_53) [5];
  char32_t (*extraout_RDX_54) [5];
  char32_t (*extraout_RDX_56) [5];
  char32_t (*extraout_RDX_57) [5];
  char32_t (*extraout_RDX_58) [5];
  char32_t (*extraout_RDX_59) [5];
  char32_t (*extraout_RDX_60) [5];
  char32_t (*pacVar4) [5];
  char32_t (*extraout_RDX_61) [5];
  char32_t (*extraout_RDX_63) [7];
  char32_t (*extraout_RDX_64) [7];
  char32_t (*extraout_RDX_65) [7];
  char32_t (*extraout_RDX_66) [7];
  char32_t (*extraout_RDX_67) [7];
  char32_t (*extraout_RDX_68) [7];
  char32_t (*extraout_RDX_70) [7];
  char32_t (*extraout_RDX_71) [7];
  char32_t (*extraout_RDX_72) [7];
  char32_t (*extraout_RDX_73) [7];
  char32_t (*extraout_RDX_74) [7];
  char32_t (*extraout_RDX_75) [7];
  char32_t (*extraout_RDX_77) [7];
  char32_t (*extraout_RDX_78) [7];
  char32_t (*extraout_RDX_79) [7];
  char32_t (*extraout_RDX_80) [7];
  char32_t (*extraout_RDX_81) [7];
  char32_t (*extraout_RDX_82) [7];
  char32_t (*extraout_RDX_84) [7];
  char32_t (*extraout_RDX_85) [7];
  char32_t (*extraout_RDX_86) [7];
  char32_t (*extraout_RDX_87) [7];
  char32_t (*extraout_RDX_88) [7];
  char32_t (*extraout_RDX_89) [7];
  char32_t (*extraout_RDX_91) [7];
  char32_t (*extraout_RDX_92) [7];
  char32_t (*extraout_RDX_93) [7];
  char32_t (*extraout_RDX_94) [7];
  char32_t (*extraout_RDX_95) [7];
  char32_t (*pacVar5) [7];
  char32_t (*extraout_RDX_96) [7];
  char32_t (*extraout_RDX_98) [20];
  char32_t (*extraout_RDX_99) [20];
  char32_t (*extraout_RDX_x00100) [20];
  char32_t (*extraout_RDX_x00101) [20];
  char32_t (*extraout_RDX_x00102) [20];
  char32_t (*extraout_RDX_x00103) [20];
  char32_t (*extraout_RDX_x00105) [20];
  char32_t (*extraout_RDX_x00106) [20];
  char32_t (*extraout_RDX_x00107) [20];
  char32_t (*extraout_RDX_x00108) [20];
  char32_t (*extraout_RDX_x00109) [20];
  char32_t (*extraout_RDX_x00110) [20];
  char32_t (*extraout_RDX_x00112) [20];
  char32_t (*extraout_RDX_x00113) [20];
  char32_t (*extraout_RDX_x00114) [20];
  char32_t (*extraout_RDX_x00115) [20];
  char32_t (*extraout_RDX_x00116) [20];
  char32_t (*pacVar6) [20];
  char32_t (*extraout_RDX_x00117) [20];
  pointer *__ptr_17;
  pointer *__ptr;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_02;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_03;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_04;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_05;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_06;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_07;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_08;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_09;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_10;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_11;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_12;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_13;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_14;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_15;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_16;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_00;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_01;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_02;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_03;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_04;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_05;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_06;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_07;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_08;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_09;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_10;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_11;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_12;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_13;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_14;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_15;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix_16;
  size_type __dnew;
  AssertionResult gtest_ar_;
  size_type local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  char local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_40;
  char32_t (*extraout_RDX) [5];
  char32_t (*extraout_RDX_06) [5];
  char32_t (*extraout_RDX_13) [5];
  char32_t (*extraout_RDX_20) [5];
  char32_t (*extraout_RDX_27) [5];
  char32_t (*extraout_RDX_34) [5];
  char32_t (*extraout_RDX_41) [5];
  char32_t (*extraout_RDX_48) [5];
  char32_t (*extraout_RDX_55) [5];
  char32_t (*extraout_RDX_62) [7];
  char32_t (*extraout_RDX_69) [7];
  char32_t (*extraout_RDX_76) [7];
  char32_t (*extraout_RDX_83) [7];
  char32_t (*extraout_RDX_90) [7];
  char32_t (*extraout_RDX_97) [20];
  char32_t (*extraout_RDX_x00104) [20];
  char32_t (*extraout_RDX_x00111) [20];
  
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_RDX);
  paVar1 = &local_70.field_2;
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string._M_str = local_40._M_dataplus._M_p;
  in_string._M_len = local_40._M_string_length;
  in_prefix._M_str = local_70._M_dataplus._M_p;
  in_prefix._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string,in_prefix);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_00;
  }
  paVar2 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_01;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xf8,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_04;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_05;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_00._M_str = local_40._M_dataplus._M_p;
  in_string_00._M_len = local_40._M_string_length;
  in_prefix_00._M_str = local_70._M_dataplus._M_p;
  in_prefix_00._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_00,in_prefix_00);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_08;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfa,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_09;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_11;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_12;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_01._M_str = local_40._M_dataplus._M_p;
  in_string_01._M_len = local_40._M_string_length;
  in_prefix_01._M_str = local_70._M_dataplus._M_p;
  in_prefix_01._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_01,in_prefix_01);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_15;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfc,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_17;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_18;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_19;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_02._M_str = local_40._M_dataplus._M_p;
  in_string_02._M_len = local_40._M_string_length;
  in_prefix_02._M_str = local_70._M_dataplus._M_p;
  in_prefix_02._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_02,in_prefix_02);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_21;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_22;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xfe,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_23;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_24;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_25;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_26;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABcd",pacVar4);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_03._M_str = local_40._M_dataplus._M_p;
  in_string_03._M_len = local_40._M_string_length;
  in_prefix_03._M_str = local_70._M_dataplus._M_p;
  in_prefix_03._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_03,in_prefix_03);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_28;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_29;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x100,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_31;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_32;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_33;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",pacVar4);
  local_78 = 6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'z';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'z';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_04._M_str = local_40._M_dataplus._M_p;
  in_string_04._M_len = local_40._M_string_length;
  in_prefix_04._M_str = local_70._M_dataplus._M_p;
  in_prefix_04._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_04,in_prefix_04);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_34;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_35;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_36;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x104,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_37;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_38;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_39;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_40;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",pacVar4);
  local_78 = 6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'z';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'z';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_05._M_str = local_40._M_dataplus._M_p;
  in_string_05._M_len = local_40._M_string_length;
  in_prefix_05._M_str = local_70._M_dataplus._M_p;
  in_prefix_05._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_05,in_prefix_05);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_41;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_42;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_43;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x106,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_44;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_45;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_46;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_47;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",pacVar4);
  local_78 = 6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'z';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'z';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_06._M_str = local_40._M_dataplus._M_p;
  in_string_06._M_len = local_40._M_string_length;
  in_prefix_06._M_str = local_70._M_dataplus._M_p;
  in_prefix_06._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_06,in_prefix_06);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_48;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_49;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_50;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCD\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcdzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x108,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_51;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_52;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_53;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_54;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"abcd",pacVar4);
  local_78 = 6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'z';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'z';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_07._M_str = local_40._M_dataplus._M_p;
  in_string_07._M_len = local_40._M_string_length;
  in_prefix_07._M_str = local_70._M_dataplus._M_p;
  in_prefix_07._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_07,in_prefix_07);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar4 = extraout_RDX_55;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar4 = extraout_RDX_56;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar4 = extraout_RDX_57;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x10a,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar4 = extraout_RDX_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar4 = extraout_RDX_59;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar4 = extraout_RDX_60;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar4 = extraout_RDX_61;
  }
  jessilib::string_cast<char16_t,char32_t[5]>(&local_40,(jessilib *)L"ABcd",pacVar4);
  local_78 = 6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'z';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'z';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_08._M_str = local_40._M_dataplus._M_p;
  in_string_08._M_len = local_40._M_string_length;
  in_prefix_08._M_str = local_70._M_dataplus._M_p;
  in_prefix_08._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_08,in_prefix_08);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_62;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar5 = extraout_RDX_63;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_64;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcd\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCDzz\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x10c,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar5 = extraout_RDX_65;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_66;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_67;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar5 = extraout_RDX_68;
  }
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",pacVar5);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_09._M_str = local_40._M_dataplus._M_p;
  in_string_09._M_len = local_40._M_string_length;
  in_prefix_09._M_str = local_70._M_dataplus._M_p;
  in_prefix_09._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_09,in_prefix_09);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_69;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar5 = extraout_RDX_70;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_71;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x110,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar5 = extraout_RDX_72;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_73;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_74;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar5 = extraout_RDX_75;
  }
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",pacVar5);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_10._M_str = local_40._M_dataplus._M_p;
  in_string_10._M_len = local_40._M_string_length;
  in_prefix_10._M_str = local_70._M_dataplus._M_p;
  in_prefix_10._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_10,in_prefix_10);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_76;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar5 = extraout_RDX_77;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_78;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x112,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar5 = extraout_RDX_79;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_80;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_81;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar5 = extraout_RDX_82;
  }
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"ABCDzz",pacVar5);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'c';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'd';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_11._M_str = local_40._M_dataplus._M_p;
  in_string_11._M_len = local_40._M_string_length;
  in_prefix_11._M_str = local_70._M_dataplus._M_p;
  in_prefix_11._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_11,in_prefix_11);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_83;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar5 = extraout_RDX_84;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_85;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABCDzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abcd\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x114,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar5 = extraout_RDX_86;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_87;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_88;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar5 = extraout_RDX_89;
  }
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"abcdzz",pacVar5);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x4200000041;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_12._M_str = local_40._M_dataplus._M_p;
  in_string_12._M_len = local_40._M_string_length;
  in_prefix_12._M_str = local_70._M_dataplus._M_p;
  in_prefix_12._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_12,in_prefix_12);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar5 = extraout_RDX_90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar5 = extraout_RDX_91;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar5 = extraout_RDX_92;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"abcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"ABCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x116,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar5 = extraout_RDX_93;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar5 = extraout_RDX_94;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar5 = extraout_RDX_95;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar5 = extraout_RDX_96;
  }
  jessilib::string_cast<char16_t,char32_t[7]>(&local_40,(jessilib *)L"ABcdzz",pacVar5);
  local_78 = 4;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(undefined8 *)local_70._M_dataplus._M_p = 0x6200000061;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L'C';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L'D';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_13._M_str = local_40._M_dataplus._M_p;
  in_string_13._M_len = local_40._M_string_length;
  in_prefix_13._M_str = local_70._M_dataplus._M_p;
  in_prefix_13._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_13,in_prefix_13);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar6 = extraout_RDX_97;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar6 = extraout_RDX_98;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar6 = extraout_RDX_99;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"ABcdzz\"), jessilib::string_cast<typename TypeParam::second_type>(U\"abCD\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x118,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar6 = extraout_RDX_x00100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar6 = extraout_RDX_x00101;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar6 = extraout_RDX_x00102;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar6 = extraout_RDX_x00103;
  }
  jessilib::string_cast<char16_t,char32_t[20]>(&local_40,(jessilib *)L"Les Bean del Dallas",pacVar6)
  ;
  local_70.field_2._M_allocated_capacity = (size_type)&DAT_650000006c;
  local_70.field_2._8_8_ = 0x73;
  local_70._M_string_length = 3;
  in_string_14._M_str = local_40._M_dataplus._M_p;
  in_string_14._M_len = local_40._M_string_length;
  in_prefix_14._M_str = (char32_t *)paVar1;
  in_prefix_14._M_len = 3;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_14,in_prefix_14);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar6 = extraout_RDX_x00104;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar6 = extraout_RDX_x00105;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar6 = extraout_RDX_x00106;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"les\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11b,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar6 = extraout_RDX_x00107;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar6 = extraout_RDX_x00108;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar6 = extraout_RDX_x00109;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar6 = extraout_RDX_x00110;
  }
  jessilib::string_cast<char16_t,char32_t[20]>(&local_40,(jessilib *)L"Les Bean del Dallas",pacVar6)
  ;
  local_78 = 8;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       _M_create(&local_70,&local_78,0);
  local_70.field_2._M_allocated_capacity = local_78;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 4) = L'B';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 5) = L'e';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 6) = L'a';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 7) = L'n';
  *(undefined8 *)local_70._M_dataplus._M_p = 0x650000006c;
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 2) = L's';
  *(char32_t *)
   ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
     *)local_70._M_dataplus._M_p + 3) = L' ';
  local_70._M_string_length = local_78;
  local_70._M_dataplus._M_p[local_78] = L'\0';
  in_string_15._M_str = local_40._M_dataplus._M_p;
  in_string_15._M_len = local_40._M_string_length;
  in_prefix_15._M_str = local_70._M_dataplus._M_p;
  in_prefix_15._M_len = local_78;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_15,in_prefix_15);
  local_50[0] = sVar3 != 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pacVar6 = extraout_RDX_x00111;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
    pacVar6 = extraout_RDX_x00112;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
    pacVar6 = extraout_RDX_x00113;
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"les Bean\"))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11d,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    pacVar6 = extraout_RDX_x00114;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pacVar6 = extraout_RDX_x00115;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      pacVar6 = extraout_RDX_x00116;
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
    pacVar6 = extraout_RDX_x00117;
  }
  jessilib::string_cast<char16_t,char32_t[20]>(&local_40,(jessilib *)L"Les Bean del Dallas",pacVar6)
  ;
  local_70.field_2._M_allocated_capacity = 0x6500000064;
  local_70.field_2._8_8_ = 0x6c;
  local_70._M_string_length = 3;
  in_string_16._M_str = local_40._M_dataplus._M_p;
  in_string_16._M_len = local_40._M_string_length;
  in_prefix_16._M_str = (char32_t *)paVar1;
  in_prefix_16._M_len = 3;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  sVar3 = jessilib::starts_with_lengthi<char16_t,char32_t>(in_string_16,in_prefix_16);
  local_50[0] = sVar3 == 0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_40,local_50,
               "starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U\"Les Bean del Dallas\"), jessilib::string_cast<typename TypeParam::second_type>(U\"del\"))"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x11f,(char *)local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, starts_withi) {
	// TypeParam::first_type == TypeParam::second_type
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	// TypeParam::first_type starts_with TypeParam::second_type... (always false)
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCD"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcdzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCDzz")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcd"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCDzz")));

	// TypeParam::first_type... starts_with TypeParam::second_type (always same results as first)
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABCDzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abcd")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"abcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"ABCD")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"ABcdzz"),
		jessilib::string_cast<typename TypeParam::second_type>(U"abCD")));

	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les")));
	EXPECT_TRUE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"les Bean")));
	EXPECT_FALSE(starts_withi(jessilib::string_cast<typename TypeParam::first_type>(U"Les Bean del Dallas"),
		jessilib::string_cast<typename TypeParam::second_type>(U"del")));
}